

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void * VmaMalloc(VkAllocationCallbacks *pAllocationCallbacks,size_t size,size_t alignment)

{
  void *pvVar1;
  
  if ((pAllocationCallbacks != (VkAllocationCallbacks *)0x0) &&
     (pAllocationCallbacks->pfnAllocation != (PFN_vkAllocationFunction)0x0)) {
    pvVar1 = (*pAllocationCallbacks->pfnAllocation)
                       (pAllocationCallbacks->pUserData,size,alignment,
                        VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);
    return pvVar1;
  }
  pvVar1 = (void *)aligned_alloc(alignment);
  return pvVar1;
}

Assistant:

static void* VmaMalloc(const VkAllocationCallbacks* pAllocationCallbacks, size_t size, size_t alignment)
{
    void* result = VMA_NULL;
    if ((pAllocationCallbacks != VMA_NULL) &&
        (pAllocationCallbacks->pfnAllocation != VMA_NULL))
    {
        result = (*pAllocationCallbacks->pfnAllocation)(
            pAllocationCallbacks->pUserData,
            size,
            alignment,
            VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);
    }
    else
    {
        result = VMA_SYSTEM_ALIGNED_MALLOC(size, alignment);
    }
    VMA_ASSERT(result != VMA_NULL && "CPU memory allocation failed.");
    return result;
}